

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.cpp
# Opt level: O0

CallbackResult __thiscall StringBTree::traverseCallback(StringBTree *this,uint8_t *data)

{
  uint uVar1;
  uint8_t *puVar2;
  char *pcVar3;
  ostream *poVar4;
  string str;
  KeyType obj;
  CallbackResult result;
  uint8_t *in_stack_ffffffffffffff70;
  KeyType *in_stack_ffffffffffffff78;
  StringKey *this_00;
  StringBTree *in_stack_ffffffffffffff80;
  allocator local_49;
  string local_48 [32];
  StringKey local_28;
  CallbackResult local_14;
  
  local_14 = CONTINUE;
  StringKey::StringKey(&local_28);
  puVar2 = parseData(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
  if (puVar2 == (uint8_t *)0x0) {
    poVar4 = std::operator<<((ostream *)&std::cerr,"Cannot parse String object.");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  }
  else {
    this_00 = &local_28;
    pcVar3 = StringKey::value(this_00);
    uVar1 = StringKey::length(this_00);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_48,pcVar3,(ulong)uVar1,&local_49);
    std::allocator<char>::~allocator((allocator<char> *)&local_49);
    poVar4 = std::operator<<((ostream *)&std::cout,local_48);
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string(local_48);
  }
  return local_14;
}

Assistant:

StringBTree::CallbackResult StringBTree::traverseCallback(const uint8_t* data) const
{
	CallbackResult result = CallbackResult::CONTINUE;

	KeyType obj;
	if (parseData(obj, data)) {
		std::string str(obj.value(), obj.length());
		std::cout << str << std::endl;
	} else {
		std::cerr << "Cannot parse String object." << std::endl;
	}

	return result;
}